

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_fragment_shading_rate_enums_features
          (Impl *this,Value *state,VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV **out_features
          )

{
  uint uVar1;
  VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV *pVVar2;
  Type pGVar3;
  
  pVVar2 = ScratchAllocator::allocate_cleared<VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV>
                     (&this->allocator);
  *out_features = pVVar2;
  pGVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"fragmentShadingRateEnums");
  uVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar3);
  pVVar2->fragmentShadingRateEnums = uVar1;
  pGVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"noInvocationFragmentShadingRates");
  uVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar3);
  pVVar2->noInvocationFragmentShadingRates = uVar1;
  pGVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"supersampleFragmentShadingRates");
  uVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar3);
  pVVar2->supersampleFragmentShadingRates = uVar1;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_fragment_shading_rate_enums_features(
		const Value &state,
		VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV **out_features)
{
	auto *features = allocator.allocate_cleared<VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV>();
	*out_features = features;

	features->fragmentShadingRateEnums = state["fragmentShadingRateEnums"].GetUint();
	features->noInvocationFragmentShadingRates = state["noInvocationFragmentShadingRates"].GetUint();
	features->supersampleFragmentShadingRates = state["supersampleFragmentShadingRates"].GetUint();
	return true;
}